

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O2

void rlib::string::inner::
     f<char,int_const,std::__cxx11::string&,std::vector<rlib::JsonT<void>,std::allocator<rlib::JsonT<void>>>const&>
               (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *format,int *head,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,
               vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *tail_1)

{
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *format_00;
  
  format_00 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,int_const&>
                        (format,head);
  f<char,std::__cxx11::string,std::vector<rlib::JsonT<void>,std::allocator<rlib::JsonT<void>>>const&>
            (format_00,tail,tail_1);
  return;
}

Assistant:

void f(boost::basic_format<CharT>& format, Head& head, Tail&&... tail) {
				using HeadT = std::remove_const_t<Head>;
				if constexpr (IsUniquePtr<HeadT>::value || IsSharedPtr<HeadT>::value || IsOptional<HeadT>::value) {
					if (head) {
						f<CharT>(format, *head, tail...);
					} else {
						f<CharT>(format % "(null)", tail...);
					}
				} else if constexpr (IsPair<HeadT>::value) {
					f<CharT>(format, head.first, head.second, tail...);
				} else if constexpr (IsTuple<HeadT>::value) {
					f<0, CharT>(format, head, tail...);
				} else if constexpr (IsArray<HeadT>::value || IsVector<HeadT>::value || IsList<HeadT>::value || IsDeque<HeadT>::value
					|| IsInitializerList<HeadT>::value || IsSet<HeadT>::value || IsMultiSet<HeadT>::value
					|| IsMap<HeadT>::value || IsMultiMap<HeadT>::value)		// 範囲ループ可の型か？っていう便利記述がもしあるなら知りたい
				{
					for (const auto& i : head) {
						f<CharT>(format, i);
					}
					f<CharT>(format, tail...);
#if defined(_MSC_VER) && defined(AFX_EXT_CLASS)
				} else if constexpr (std::is_same_v<HeadT, CStringA> || std::is_same_v<HeadT, CStringW>) {
					f<CharT>(format % std::basic_string<CharT>(head.GetString()), tail...);
#endif
				} else {
					f<CharT>(format % head, tail...);
				}
			}